

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O2

void __thiscall absl::lts_20250127::crc_internal::CRC32::Scramble(CRC32 *this,uint32_t *crc)

{
  *crc = (*crc + 0x2e76e41b) * 0x8000 | *crc + 0x2e76e41b >> 0x11;
  return;
}

Assistant:

void CRC32::Scramble(uint32_t* crc) const {
  // Rotate by near half the word size plus 1.  See the scramble comment in
  // crc_internal.h for an explanation.
  constexpr int scramble_rotate = (32 / 2) + 1;
  *crc = RotateRight<uint32_t>(static_cast<unsigned int>(*crc + kScrambleLo),
                               32, scramble_rotate) &
         MaskOfLength<uint32_t>(32);
}